

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prometheus.cc
# Opt level: O0

string * __thiscall
instrumentation::(anonymous_namespace)::prom_collector::quote_string_abi_cxx11_
          (string *__return_storage_ptr__,prom_collector *this,string_view s)

{
  char cVar1;
  const_iterator pvVar2;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  undefined1 local_20 [8];
  string_view s_local;
  string *out;
  
  s_local._M_len = s._M_len;
  local_20 = (undefined1  [8])this;
  s_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  for (; __end2 != pvVar2; __end2 = __end2 + 1) {
    cVar1 = *__end2;
    if (cVar1 == '\n') {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if (cVar1 == '\"') {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if (cVar1 == '\\') {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  return __return_storage_ptr__;
}

Assistant:

static auto quote_string(std::string_view s) -> std::string {
    std::string out;
    out.reserve(s.size() + 2u);

    out.append(1, '"');

    for (char c : s) {
      switch (c) {
      default:
        out.push_back(c);
        break;
      case '\n':
        out.append(R"(\n)");
        break;
      case '\\':
        out.append(R"(\\)");
        break;
      case '"':
        out.append(R"(\")");
        break;
      }
    }

    out.append(1, '"');
    return out;
  }